

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIntegers.h
# Opt level: O1

double HighsIntegers::integralScale(double *vals,HighsInt numVals,double deltadown,double deltaup)

{
  ulong uVar1;
  ulong uVar2;
  int64_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  pair<const_double_*,_const_double_*> pVar19;
  int expshift;
  HighsCDouble val;
  int expMaxVal;
  int local_8c;
  HighsCDouble local_88;
  double local_78;
  HighsCDouble local_70;
  double local_60;
  double local_58;
  ulong local_40;
  int local_34;
  
  if (numVals == 0) {
    dVar12 = 0.0;
  }
  else {
    local_60 = deltaup;
    local_58 = deltadown;
    pVar19 = std::
             __minmax_element<double_const*,__gnu_cxx::__ops::_Iter_comp_iter<HighsIntegers::integralScale(double_const*,int,double,double)::_lambda(double,double)_1_>>
                       (vals,vals + numVals);
    dVar12 = *pVar19.first;
    local_8c = 0;
    if ((dVar12 < -local_58) || (dVar11 = *pVar19.second, local_60 < dVar12)) {
      local_78 = *pVar19.second;
      frexp(dVar12,&local_8c);
      dVar11 = local_78;
    }
    iVar8 = -local_8c;
    if (-1 < local_8c) {
      iVar8 = 0;
    }
    local_8c = iVar8 + 3;
    frexp(dVar11,&local_34);
    if (0x1f < local_34) {
      local_34 = 0x20;
    }
    if (0x20 < local_34 + iVar8 + 3) {
      local_8c = 0x20 - local_34;
    }
    uVar7 = 0x4bL << ((byte)local_8c & 0x3f);
    local_70.hi = *vals;
    local_70.lo = 0.0;
    local_88 = HighsCDouble::operator*(&local_70,(double)(long)uVar7);
    dVar18 = local_88.lo;
    dVar12 = local_88.hi;
    local_70.hi = dVar12 + local_60;
    dVar11 = dVar12 - (local_70.hi - (local_70.hi - dVar12));
    local_70.lo = (local_60 - (local_70.hi - dVar12)) + dVar11 + dVar18;
    dVar12 = floor(dVar11);
    dVar11 = local_88.hi - dVar12;
    dVar11 = (((-dVar12 - (dVar11 - local_88.hi)) +
               (local_88.hi - (dVar11 - (dVar11 - local_88.hi))) + local_88.lo) - dVar18) + dVar11;
    uVar9 = uVar7;
    if (local_58 < dVar11) {
      iVar3 = denominator(dVar11,local_60,1000);
      uVar9 = iVar3 * uVar7;
      auVar15._8_4_ = (int)(uVar9 >> 0x20);
      auVar15._0_8_ = uVar9;
      auVar15._12_4_ = 0x45300000;
      local_70.hi = *vals;
      local_70.lo = 0.0;
      local_88 = HighsCDouble::operator*
                           (&local_70,
                            (auVar15._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
      dVar18 = local_88.lo;
      dVar12 = local_88.hi;
      local_70.hi = dVar12 + local_60;
      dVar11 = dVar12 - (local_70.hi - (local_70.hi - dVar12));
      local_70.lo = (local_60 - (local_70.hi - dVar12)) + dVar11 + dVar18;
      dVar12 = floor(dVar11);
      dVar11 = local_88.hi - dVar12;
      if (local_58 <
          (((-dVar12 - (dVar11 - local_88.hi)) + (local_88.hi - (dVar11 - (dVar11 - local_88.hi))) +
           local_88.lo) - dVar18) + dVar11) {
        return 0.0;
      }
    }
    uVar4 = (ulong)ABS(dVar12 + dVar18);
    uVar4 = (long)(ABS(dVar12 + dVar18) - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
    bVar10 = numVals == 1;
    if (!bVar10) {
      local_40 = (ulong)(uint)numVals;
      uVar6 = 1;
      uVar5 = uVar4;
      local_78 = (double)uVar7;
      do {
        auVar16._8_4_ = (int)(uVar9 >> 0x20);
        auVar16._0_8_ = uVar9;
        auVar16._12_4_ = 0x45300000;
        local_70.hi = vals[uVar6];
        local_70.lo = 0.0;
        local_88 = HighsCDouble::operator*
                             (&local_70,
                              (auVar16._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
        dVar18 = local_88.lo;
        dVar12 = local_88.hi;
        local_70.hi = dVar12 + local_60;
        dVar11 = dVar12 - (local_70.hi - (local_70.hi - dVar12));
        local_70.lo = (local_60 - (local_70.hi - dVar12)) + dVar11 + dVar18;
        dVar12 = floor(dVar11);
        dVar11 = local_88.hi - dVar12;
        if (local_58 <
            (((-dVar12 - (dVar11 - local_88.hi)) + (local_88.hi - (dVar11 - (dVar11 - local_88.hi)))
             + local_88.lo) - dVar18) + dVar11) {
          local_70.hi = vals[uVar6];
          local_70.lo = 0.0;
          local_88 = HighsCDouble::operator*(&local_70,(double)(long)local_78);
          dVar11 = local_88.lo;
          dVar12 = floor(local_88.hi);
          dVar18 = local_88.hi - dVar12;
          iVar3 = denominator((((-dVar12 - (dVar18 - local_88.hi)) +
                                (local_88.hi - (dVar18 - (dVar18 - local_88.hi))) + local_88.lo) -
                              dVar11) + dVar18,local_60,1000);
          uVar9 = uVar9 * iVar3;
          auVar17._8_4_ = (int)(uVar9 >> 0x20);
          auVar17._0_8_ = uVar9;
          auVar17._12_4_ = 0x45300000;
          local_70.hi = vals[uVar6];
          local_70.lo = 0.0;
          local_88 = HighsCDouble::operator*
                               (&local_70,
                                (auVar17._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
          dVar18 = local_88.lo;
          dVar12 = local_88.hi;
          local_70.hi = dVar12 + local_60;
          dVar11 = dVar12 - (local_70.hi - (local_70.hi - dVar12));
          local_70.lo = (local_60 - (local_70.hi - dVar12)) + dVar11 + dVar18;
          dVar12 = floor(dVar11);
          dVar11 = local_88.hi - dVar12;
          uVar4 = uVar5;
          if (local_58 <
              (((-dVar12 - (dVar11 - local_88.hi)) +
                (local_88.hi - (dVar11 - (dVar11 - local_88.hi))) + local_88.lo) - dVar18) + dVar11)
          break;
        }
        uVar4 = 1;
        if (uVar5 != 1) {
          uVar4 = (ulong)(dVar12 + dVar18);
          uVar7 = -uVar4;
          if (0 < (long)uVar4) {
            uVar7 = uVar4;
          }
          if (uVar5 != 0) {
            uVar2 = -uVar5;
            uVar1 = uVar7;
            if (0 < (long)uVar5) {
              uVar2 = uVar5;
            }
            while (uVar7 = uVar2, uVar4 != 0) {
              uVar4 = uVar7 % uVar1;
              uVar2 = uVar1;
              uVar1 = uVar4;
            }
          }
          uVar4 = uVar7;
          if (uVar9 >> 0x20 != 0) {
            uVar9 = uVar9 / uVar7;
            uVar4 = 1;
            if (local_78 == 4.94065645841247e-324) {
              local_78 = 4.94065645841247e-324;
            }
            else {
              uVar5 = -uVar7;
              if (0 < (long)uVar7) {
                uVar5 = uVar7;
              }
              if (local_78 != 0.0) {
                uVar7 = uVar5;
                dVar12 = (double)-(long)local_78;
                if (0 < (long)local_78) {
                  dVar12 = local_78;
                }
                do {
                  uVar5 = (ulong)dVar12;
                  dVar12 = (double)(uVar7 % uVar5);
                  uVar7 = uVar5;
                } while (dVar12 != 0.0);
              }
              local_78 = (double)((long)local_78 / (long)uVar5);
            }
          }
        }
        uVar6 = uVar6 + 1;
        bVar10 = uVar6 == local_40;
        uVar5 = uVar4;
      } while (!bVar10);
    }
    if (bVar10) {
      auVar13._8_4_ = (int)(uVar9 >> 0x20);
      auVar13._0_8_ = uVar9;
      auVar13._12_4_ = 0x45300000;
      auVar14._8_4_ = (int)(uVar4 >> 0x20);
      auVar14._0_8_ = uVar4;
      auVar14._12_4_ = 0x45300000;
      dVar12 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0)) /
               ((auVar14._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
    }
    else {
      dVar12 = 0.0;
    }
  }
  return dVar12;
}

Assistant:

static double integralScale(const double* vals, HighsInt numVals,
                              double deltadown, double deltaup) {
    if (numVals == 0) return 0.0;

    auto minmax = std::minmax_element(
        vals, vals + numVals,
        [](double a, double b) { return std::abs(a) < std::abs(b); });
    const double minval = *minmax.first;
    const double maxval = *minmax.second;

    int expshift = 0;

    // to cover many small denominators at once use a denominator of 75 * 2^n
    // with n-3 being large enough so that the smallest value is not below 0.5
    // but ignore tiny values bew deltadown/deltaup.
    if (minval < -deltadown || minval > deltaup) std::frexp(minval, &expshift);
    expshift = std::max(-expshift, 0) + 3;

    // guard against making the largest value too big which may cause overflows
    // with intermediate gcd values
    int expMaxVal;
    std::frexp(maxval, &expMaxVal);
    expMaxVal = std::min(expMaxVal, 32);
    if (expMaxVal + expshift > 32) expshift = 32 - expMaxVal;

    uint64_t denom = uint64_t{75} << expshift;
    int64_t startdenom = denom;
    // now check if the values are integral and if not compute a common
    // denominator for their remaining fraction
    HighsCDouble val = startdenom * HighsCDouble(vals[0]);
    HighsCDouble downval = floor(val + deltaup);
    HighsCDouble fraction = val - downval;

    if (fraction > deltadown) {
      // use a continued fraction algorithm to compute small missing
      // denominators for the remaining fraction
      denom *= denominator(double(fraction), deltaup, 1000);
      val = denom * HighsCDouble(vals[0]);
      downval = floor(val + deltaup);
      fraction = val - downval;

      // if this is not sufficient for reaching integrality, we stop here
      if (fraction > deltadown) return 0.0;
    }

    uint64_t currgcd = (uint64_t)std::abs(double(downval));

    for (HighsInt i = 1; i != numVals; ++i) {
      val = denom * HighsCDouble(vals[i]);
      downval = floor(val + deltaup);
      fraction = val - downval;

      if (fraction > deltadown) {
        val = startdenom * HighsCDouble(vals[i]);
        fraction = val - floor(val);
        denom *= denominator(double(fraction), deltaup, 1000);
        val = denom * HighsCDouble(vals[i]);
        downval = floor(val + deltaup);
        fraction = val - downval;

        if (fraction > deltadown) return 0.0;
      }

      if (currgcd != 1) {
        currgcd = gcd(currgcd, (int64_t) double(downval));

        // if the denominator is large, divide by the current gcd to prevent
        // unnecessary overflows
        if (denom > std::numeric_limits<unsigned int>::max()) {
          denom /= currgcd;
          if (startdenom != 1) startdenom /= gcd(currgcd, startdenom);
          currgcd = 1;
        }
      }
    }

    return static_cast<double>(denom) / static_cast<double>(currgcd);
  }